

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dePoolArray.c
# Opt level: O0

deBool dePoolArray_reserve(dePoolArray *arr,int size)

{
  deInt32 dVar1;
  int b;
  int iVar2;
  int iVar3;
  void **ppvVar4;
  void *pvVar5;
  void *newPage_1;
  void *newPage;
  int pageTableNdx;
  int pageAllocSize;
  int i;
  void **newPageTable;
  int newPageTableCapacity;
  int reqPageTableCapacity;
  int newCapacity;
  int oldPageTableSize;
  void *oldPageTable;
  int size_local;
  dePoolArray *arr_local;
  
  if (arr->capacity <= size) {
    _newCapacity = (void **)0x0;
    reqPageTableCapacity = 0;
    dVar1 = deAlign32(size,0x10);
    b = dVar1 >> 4;
    if (arr->pageTableCapacity < b) {
      iVar2 = deMax32(arr->pageTableCapacity << 1,b);
      ppvVar4 = (void **)deMemPool_alloc(arr->pool,(long)iVar2 << 3);
      if (ppvVar4 == (void **)0x0) {
        return 0;
      }
      for (pageTableNdx = 0; pageTableNdx < arr->pageTableCapacity; pageTableNdx = pageTableNdx + 1)
      {
        ppvVar4[pageTableNdx] = arr->pageTable[pageTableNdx];
      }
      for (; pageTableNdx < iVar2; pageTableNdx = pageTableNdx + 1) {
        ppvVar4[pageTableNdx] = (void *)0x0;
      }
      _newCapacity = arr->pageTable;
      reqPageTableCapacity = arr->pageTableCapacity << 3;
      arr->pageTable = ppvVar4;
      arr->pageTableCapacity = iVar2;
    }
    iVar2 = arr->elementSize;
    iVar3 = iVar2 * 0x10;
    newPage._4_4_ = arr->capacity >> 4;
    for (; iVar3 <= reqPageTableCapacity;
        reqPageTableCapacity = reqPageTableCapacity + iVar2 * -0x10) {
      arr->pageTable[newPage._4_4_] = _newCapacity;
      _newCapacity = (void **)((long)_newCapacity + (long)iVar3);
      newPage._4_4_ = newPage._4_4_ + 1;
    }
    for (; newPage._4_4_ < b; newPage._4_4_ = newPage._4_4_ + 1) {
      pvVar5 = deMemPool_alloc(arr->pool,(long)iVar3);
      if (pvVar5 == (void *)0x0) {
        return 0;
      }
      arr->pageTable[newPage._4_4_] = pvVar5;
    }
    arr->capacity = newPage._4_4_ << 4;
  }
  return 1;
}

Assistant:

deBool			dePoolArray_reserve			(dePoolArray* arr, int size)
{
	if (size >= arr->capacity)
	{
		void*	oldPageTable			= DE_NULL;
		int		oldPageTableSize		= 0;

		int		newCapacity				= deAlign32(size, 1 << DE_ARRAY_ELEMENTS_PER_PAGE_LOG2);
		int		reqPageTableCapacity	= newCapacity >> DE_ARRAY_ELEMENTS_PER_PAGE_LOG2;

		if (arr->pageTableCapacity < reqPageTableCapacity)
		{
			int		newPageTableCapacity	= deMax32(2*arr->pageTableCapacity, reqPageTableCapacity);
			void**	newPageTable			= (void**)deMemPool_alloc(arr->pool, (size_t)newPageTableCapacity * sizeof(void*));
			int		i;

			if (!newPageTable)
				return DE_FALSE;

			for (i = 0; i < arr->pageTableCapacity; i++)
				newPageTable[i] = arr->pageTable[i];

			for (; i < newPageTableCapacity; i++)
				newPageTable[i] = DE_NULL;

			/* Grab information about old page table for recycling purposes. */
			oldPageTable		= arr->pageTable;
			oldPageTableSize	= arr->pageTableCapacity * (int)sizeof(void*);

			arr->pageTable			= newPageTable;
			arr->pageTableCapacity	= newPageTableCapacity;
		}

		/* Allocate new pages. */
		{
			int pageAllocSize = arr->elementSize << DE_ARRAY_ELEMENTS_PER_PAGE_LOG2;
			int pageTableNdx = arr->capacity >> DE_ARRAY_ELEMENTS_PER_PAGE_LOG2;

			/* Allocate new pages from recycled old page table. */
			while (oldPageTableSize >= pageAllocSize)
			{
				void* newPage = oldPageTable;
				DE_ASSERT(arr->pageTableCapacity > pageTableNdx); /* \todo [petri] is this always true? */
				DE_ASSERT(!arr->pageTable[pageTableNdx]);
				arr->pageTable[pageTableNdx++] = newPage;

				oldPageTable = (void*)((deUint8*)oldPageTable + pageAllocSize);
				oldPageTableSize -= pageAllocSize;
			}

			/* Allocate the rest of the needed pages from the pool. */
			for (; pageTableNdx < reqPageTableCapacity; pageTableNdx++)
			{
				void* newPage = deMemPool_alloc(arr->pool, (size_t)pageAllocSize);
				if (!newPage)
					return DE_FALSE;

				DE_ASSERT(!arr->pageTable[pageTableNdx]);
				arr->pageTable[pageTableNdx] = newPage;
			}

			arr->capacity = pageTableNdx << DE_ARRAY_ELEMENTS_PER_PAGE_LOG2;
			DE_ASSERT(arr->capacity >= newCapacity);
		}
	}

	return DE_TRUE;
}